

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O2

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::resizeImageBilinear<unsigned_char>
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *__return_storage_ptr__,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long w,long h)

{
  int d;
  long lVar1;
  long lVar2;
  long i;
  long lVar3;
  vector<int,_std::allocator<int>_> v;
  allocator_type local_5d;
  float local_5c;
  float local_58;
  float local_54;
  long local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,(long)image->depth,&local_5d);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            (__return_storage_ptr__,w,h,image->depth);
  local_58 = (float)image->width / (float)w;
  local_5c = (float)image->height / (float)h;
  lVar2 = 0;
  if (w < 1) {
    w = lVar2;
  }
  local_50 = h;
  if (h < 1) {
    local_50 = lVar2;
  }
  for (; lVar2 != local_50; lVar2 = lVar2 + 1) {
    local_54 = (float)lVar2 * local_5c;
    for (lVar3 = 0; lVar3 != w; lVar3 = lVar3 + 1) {
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                (image,(vector<int,_std::allocator<int>_> *)&local_48,(float)lVar3 * local_58,
                 local_54);
      for (lVar1 = 0; lVar1 < image->depth; lVar1 = lVar1 + 1) {
        __return_storage_ptr__->img[lVar1][lVar2][lVar3] =
             (uchar)local_48._M_impl.super__Vector_impl_data._M_start[lVar1];
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Image<T> resizeImageBilinear(const Image<T> &image, long w, long h)
{
  std::vector<typename Image<T>::work_t> v(image.getDepth());
  Image<T> ret(w, h, image.getDepth());

  const float fx=static_cast<float>(image.getWidth())/w;
  const float fy=static_cast<float>(image.getHeight())/h;

  for (long k=0; k<h; k++)
  {
    for (long i=0; i<w; i++)
    {
      image.getBilinear(v, i*fx, k*fy);

      for (int d=0; d<image.getDepth(); d++)
      {
        ret.set(i, k, d, static_cast<typename Image<T>::store_t>(v[d]));
      }
    }
  }

  return ret;
}